

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::verifyAdditionalResults(BindingImagesTest *this)

{
  bool bVar1;
  BindingImagesTest *pBVar2;
  
  if (this->m_test_case == TEX_BUFFER) {
    pBVar2 = this;
    bVar1 = BindingImageTest::verifyBuffer(&this->super_BindingImageTest,&this->m_goku_buffer);
    if (bVar1) {
      bVar1 = BindingImageTest::verifyBuffer(&pBVar2->super_BindingImageTest,&this->m_vegeta_buffer)
      ;
      if (bVar1) {
        bVar1 = BindingImageTest::verifyBuffer
                          (&pBVar2->super_BindingImageTest,&this->m_trunks_buffer);
        return bVar1;
      }
    }
  }
  else {
    pBVar2 = this;
    bVar1 = BindingImageTest::verifyTexture(&this->super_BindingImageTest,&this->m_goku_texture);
    if (bVar1) {
      bVar1 = BindingImageTest::verifyTexture
                        (&pBVar2->super_BindingImageTest,&this->m_vegeta_texture);
      if (bVar1) {
        bVar1 = BindingImageTest::verifyTexture
                          (&pBVar2->super_BindingImageTest,&this->m_trunks_texture);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool BindingImagesTest::verifyAdditionalResults() const
{
	if (Utils::TEX_BUFFER != m_test_case)
	{
		return (verifyTexture(m_goku_texture) && verifyTexture(m_vegeta_texture) && verifyTexture(m_trunks_texture));
	}
	else
	{
		return (verifyBuffer(m_goku_buffer) && verifyBuffer(m_vegeta_buffer) && verifyBuffer(m_trunks_buffer));
	}
}